

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::LayoutBindingBaseCase::getDefaultUniformName_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,int idx)

{
  StringStream s;
  undefined1 local_190 [112];
  undefined **local_120;
  undefined8 local_48;
  undefined2 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  std::ios_base::ios_base((ios_base *)&local_120);
  local_120 = (undefined **)glUniformMatrix3x2fv;
  local_48 = 0;
  local_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  local_190._0_8_ = &PTR__StringStream_020f2a68;
  local_120 = &PTR__StringStream_020f2a90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"uniform",7);
  std::ostream::operator<<(local_190,idx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)&local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual String getDefaultUniformName(int idx = 0)
	{
		StringStream s;
		s << "uniform" << idx;
		return s.str();
	}